

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

void __thiscall FNodeBuilder::CreateSubsectorsForReal(FNodeBuilder *this)

{
  FPrivSeg *pFVar1;
  DWORD DVar2;
  uint uVar3;
  uint *puVar4;
  USegPtr *pUVar5;
  FPrivSeg *pFVar6;
  uint local_8c;
  USegPtr UStack_88;
  uint i_1;
  USegPtr ptr;
  uint local_78;
  DWORD firstline;
  DWORD set;
  uint i;
  subsector_t sub;
  FNodeBuilder *this_local;
  
  _set = (sector_t *)0x0;
  sub.sector = (sector_t *)0x0;
  sub.polys = (FPolyNode *)0x0;
  sub.render_sector._4_4_ = 0;
  sub.firstline = (seg_t *)0x0;
  firstline = 0;
  sub.portalcoverage[1]._8_8_ = this;
  while( true ) {
    DVar2 = firstline;
    uVar3 = TArray<unsigned_int,_unsigned_int>::Size(&this->SubsectorSets);
    if (uVar3 <= DVar2) break;
    puVar4 = TArray<unsigned_int,_unsigned_int>::operator[](&this->SubsectorSets,(ulong)firstline);
    local_78 = *puVar4;
    ptr._4_4_ = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::Size(&this->SegList);
    while (local_78 != 0xffffffff) {
      UStack_88.SegPtr =
           TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                     (&this->Segs,(ulong)local_78);
      TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::Push
                (&this->SegList,&stack0xffffffffffffff78);
      local_78 = (UStack_88.SegPtr)->next;
    }
    uVar3 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::Size(&this->SegList);
    sub.render_sector._0_4_ = uVar3 - ptr._4_4_;
    sub.BSP = (FMiniBSP *)(ulong)(uint)ptr._4_4_;
    pUVar5 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                       (&this->SegList,(ulong)(uint)ptr._4_4_);
    qsort(pUVar5,(ulong)(uint)sub.render_sector,8,SortSegs);
    local_8c = ptr._4_4_;
    while( true ) {
      uVar3 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::Size(&this->SegList);
      if (uVar3 <= local_8c) break;
      pUVar5 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                         (&this->SegList,(ulong)local_8c);
      pFVar1 = pUVar5->SegPtr;
      pFVar6 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[](&this->Segs,0);
      pUVar5 = TArray<FNodeBuilder::USegPtr,_FNodeBuilder::USegPtr>::operator[]
                         (&this->SegList,(ulong)local_8c);
      pUVar5->SegNum = (DWORD)(((long)pFVar1 - (long)pFVar6) / 0x48);
      local_8c = local_8c + 1;
    }
    TArray<subsector_t,_subsector_t>::Push(&this->Subsectors,(subsector_t *)&set);
    firstline = firstline + 1;
  }
  return;
}

Assistant:

void FNodeBuilder::CreateSubsectorsForReal ()
{
	subsector_t sub;
	unsigned int i;

	sub.sector = NULL;
	sub.polys = NULL;
	sub.BSP = NULL;
	sub.flags = 0;
	sub.render_sector = NULL;

	for (i = 0; i < SubsectorSets.Size(); ++i)
	{
		DWORD set = SubsectorSets[i];
		DWORD firstline = (DWORD)SegList.Size();

		while (set != DWORD_MAX)
		{
			USegPtr ptr;

			ptr.SegPtr = &Segs[set];
			SegList.Push (ptr);
			set = ptr.SegPtr->next;
		}
		sub.numlines = (DWORD)(SegList.Size() - firstline);
		sub.firstline = (seg_t *)(size_t)firstline;

		// Sort segs by linedef for special effects
		qsort (&SegList[firstline], sub.numlines, sizeof(USegPtr), SortSegs);

		// Convert seg pointers into indices
		D(Printf (PRINT_LOG, "Output subsector %d:\n", Subsectors.Size()));
		for (unsigned int i = firstline; i < SegList.Size(); ++i)
		{
			D(Printf (PRINT_LOG, "  Seg %5d%c%d(%5d,%5d)-%d(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", SegList[i].SegPtr - &Segs[0],
				SegList[i].SegPtr->linedef == -1 ? '+' : ' ',
				SegList[i].SegPtr->v1,
				Vertices[SegList[i].SegPtr->v1].x>>16,
				Vertices[SegList[i].SegPtr->v1].y>>16,
				SegList[i].SegPtr->v2,
				Vertices[SegList[i].SegPtr->v2].x>>16,
				Vertices[SegList[i].SegPtr->v2].y>>16,
				Vertices[SegList[i].SegPtr->v1].x, Vertices[SegList[i].SegPtr->v1].y,
				Vertices[SegList[i].SegPtr->v2].x, Vertices[SegList[i].SegPtr->v2].y));
			SegList[i].SegNum = DWORD(SegList[i].SegPtr - &Segs[0]);
		}
		Subsectors.Push (sub);
	}
}